

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Deserializer.cpp
# Opt level: O2

void __thiscall adios2::format::BP3Deserializer::BP3Deserializer(BP3Deserializer *this,Comm *comm)

{
  _Rb_tree_header *p_Var1;
  
  BPBase::BPBase((BPBase *)&this->field_0x88,comm);
  BP3Base::BP3Base((BP3Base *)this,&PTR_construction_vtable_40__0081bd68,comm);
  *(undefined8 *)this = 0x81bd00;
  *(undefined8 *)&this->field_0x88 = 0x81bd38;
  BPBase::Minifooter::Minifooter(&this->m_Minifooter,'\x03');
  this->m_PerformedGets = false;
  p_Var1 = &(this->m_DeferredVariablesMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_DeferredVariablesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_DeferredVariablesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_DeferredVariablesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_DeferredVariablesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_DeferredVariablesMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

BP3Deserializer::BP3Deserializer(helper::Comm const &comm)
: BPBase(comm), BP3Base(comm), m_Minifooter(3)
{
}